

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_icdf<trng::normal_dist<long_double>>(normal_dist<long_double> *d)

{
  longdouble lVar1;
  long lVar2;
  undefined1 x [16];
  undefined8 uVar3;
  longdouble lVar4;
  ulong uVar5;
  int i;
  int iVar6;
  AssertionHandler *this;
  AssertionHandler *pAVar7;
  AssertionHandler *this_00;
  AssertionHandler *pAVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar11;
  longdouble in_ST4;
  longdouble lVar12;
  longdouble lVar13;
  vector<long_double,_std::allocator<long_double>_> p_values;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffeb2;
  undefined1 local_128 [48];
  char *pcStack_f8;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  undefined1 local_c8 [16];
  longdouble *local_b8;
  char *local_b0;
  char *pcStack_a8;
  longdouble *local_a0;
  StringRef local_98;
  longdouble local_88;
  AssertionHandler local_78;
  
  local_e4 = (longdouble)2.7755576e-17;
  local_128._0_8_ = (AssertionHandler *)0x0;
  local_128._8_8_ = (AssertionHandler *)0x0;
  local_128._16_8_ = (longdouble *)0x0;
  local_78.m_assertionInfo.macroName._0_10_ = (BADTYPE)0.5;
  this_00 = (AssertionHandler *)local_128;
  local_d8 = local_e4;
  std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
            ((vector<long_double,_std::allocator<long_double>_> *)this_00,(iterator)0x0,
             (longdouble *)&local_78);
  iVar6 = 2;
  do {
    lVar9 = in_ST3;
    in_ST3 = in_ST4;
    lVar11 = in_ST4;
    local_128._36_4_ = iVar6;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)0 + in_ST0;
    if (local_128._8_8_ == local_128._16_8_) {
      this_00 = (AssertionHandler *)local_128;
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                ((vector<long_double,_std::allocator<long_double>_> *)local_128,
                 (iterator)local_128._8_8_,(longdouble *)&local_78);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar11;
    }
    else {
      *(unkbyte10 *)local_128._8_8_ = local_78.m_assertionInfo.macroName._0_10_;
      local_128._8_8_ = local_128._8_8_ + 0x10;
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = lVar11;
    }
    lVar11 = in_ST4;
    powl();
    local_78.m_assertionInfo.macroName._0_10_ = (longdouble)1 - in_ST1;
    if (local_128._8_8_ == local_128._16_8_) {
      this = (AssertionHandler *)local_128._8_8_;
      this_00 = (AssertionHandler *)local_128;
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                ((vector<long_double,_std::allocator<long_double>_> *)local_128,
                 (iterator)local_128._8_8_,(longdouble *)&local_78);
    }
    else {
      *(unkbyte10 *)local_128._8_8_ = local_78.m_assertionInfo.macroName._0_10_;
      this = (AssertionHandler *)(local_128._8_8_ + 0x10);
      local_128._8_8_ = this;
    }
    pAVar7 = (AssertionHandler *)local_128._8_8_;
    pAVar8 = (AssertionHandler *)local_128._0_8_;
    iVar6 = iVar6 + 1;
    in_ST1 = lVar9;
  } while (iVar6 != 0x40);
  if (local_128._0_8_ != local_128._8_8_) {
    uVar5 = (long)(local_128._8_8_ - local_128._0_8_) >> 4;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_128._0_8_,local_128._8_8_,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    this = pAVar7;
    this_00 = pAVar8;
  }
  uVar3 = local_128._8_8_;
  if (local_128._0_8_ != local_128._8_8_) {
    pAVar8 = (AssertionHandler *)local_128._0_8_;
    do {
      lVar1 = *(longdouble *)
               &((_Vector_impl *)&(pAVar8->m_assertionInfo).macroName)->super__Vector_impl_data;
      trng::math::detail::inv_Phi<long_double>((longdouble *)this_00,lVar1);
      x._10_6_ = in_stack_fffffffffffffeb2;
      x._0_10_ = in_ST0 * *(longdouble *)&(d->P).sigma_ + *(longdouble *)&(d->P).mu_;
      this_00 = (AssertionHandler *)d;
      lVar12 = lVar11;
      lVar13 = lVar11;
      trng::normal_dist<long_double>::cdf
                ((result_type_conflict3 *)d,(normal_dist<long_double> *)this,
                 (result_type_conflict3)x);
      lVar10 = ABS(lVar9 - lVar1);
      in_ST0 = in_ST2;
      lVar9 = in_ST3;
      lVar1 = in_ST4;
      lVar4 = lVar11;
      if (local_e4 <= lVar10) {
        local_c8._0_8_ = "REQUIRE";
        local_c8._8_8_ = 7;
        local_128._40_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
        ;
        pcStack_f8 = (char *)0xa8;
        Catch::StringRef::StringRef(&local_98,"std::abs(y - p) < eps");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)local_c8,(SourceLineInfo *)(local_128 + 0x28),local_98,
                   Normal);
        local_f0 = local_d8;
        local_88 = lVar10;
        Catch::StringRef::StringRef((StringRef *)(local_128 + 0x28),"<");
        local_c8[9] = lVar10 < local_f0;
        local_c8[8] = 1;
        local_c8._0_8_ = &PTR_streamReconstructedExpression_0031a338;
        local_b8 = &local_88;
        local_b0 = (char *)local_128._40_8_;
        pcStack_a8 = pcStack_f8;
        local_a0 = &local_d8;
        this = (AssertionHandler *)local_c8;
        Catch::AssertionHandler::handleExpr(&local_78,(ITransientExpression *)local_c8);
        Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c8);
        this_00 = &local_78;
        Catch::AssertionHandler::complete(&local_78);
        in_ST0 = in_ST2;
        lVar9 = in_ST3;
        lVar1 = in_ST4;
        lVar4 = lVar11;
        if (local_78.m_completed == false) {
          this = &local_78;
          this_00 = (AssertionHandler *)local_78.m_resultCapture;
          (**(code **)((((_Vector_impl *)
                        &((AssertionInfo *)&(local_78.m_resultCapture)->_vptr_IResultCapture)->
                         macroName)->super__Vector_impl_data)._M_start + 7))();
          in_ST0 = in_ST2;
          lVar9 = in_ST3;
          lVar1 = in_ST4;
          lVar4 = lVar11;
        }
      }
      lVar11 = lVar13;
      in_ST4 = lVar12;
      in_ST3 = lVar4;
      in_ST2 = lVar1;
      pAVar8 = (AssertionHandler *)&(pAVar8->m_assertionInfo).lineInfo;
    } while (pAVar8 != (AssertionHandler *)uVar3);
  }
  if ((AssertionHandler *)local_128._0_8_ != (AssertionHandler *)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}